

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O0

int skynet_mq_pop(message_queue *q,skynet_message *message)

{
  int iVar1;
  skynet_message *psVar2;
  int local_2c;
  int length;
  int cap;
  int tail;
  int head;
  int ret;
  skynet_message *message_local;
  message_queue *q_local;
  
  tail = 1;
  spinlock_lock(&q->lock);
  if (q->head == q->tail) {
    q->overload_threshold = 0x400;
  }
  else {
    iVar1 = q->head;
    q->head = iVar1 + 1;
    psVar2 = q->queue + iVar1;
    iVar1 = psVar2->session;
    message->source = psVar2->source;
    message->session = iVar1;
    message->data = psVar2->data;
    message->sz = psVar2->sz;
    tail = 0;
    cap = q->head;
    if (q->cap <= cap) {
      cap = 0;
      q->head = 0;
    }
    local_2c = q->tail - cap;
    if (local_2c < 0) {
      local_2c = q->cap + local_2c;
    }
    while (q->overload_threshold < local_2c) {
      q->overload = local_2c;
      q->overload_threshold = q->overload_threshold << 1;
    }
  }
  if (tail != 0) {
    q->in_global = 0;
  }
  spinlock_unlock(&q->lock);
  return tail;
}

Assistant:

int
skynet_mq_pop(struct message_queue *q, struct skynet_message *message) {
	int ret = 1;
	SPIN_LOCK(q)

	if (q->head != q->tail) {
		*message = q->queue[q->head++];
		ret = 0;
		int head = q->head;
		int tail = q->tail;
		int cap = q->cap;

		if (head >= cap) {
			q->head = head = 0;
		}
		int length = tail - head;
		if (length < 0) {
			length += cap;
		}
		while (length > q->overload_threshold) {
			q->overload = length;
			q->overload_threshold *= 2;
		}
	} else {
		// reset overload_threshold when queue is empty
		q->overload_threshold = MQ_OVERLOAD;
	}

	if (ret) {
		q->in_global = 0;
	}
	
	SPIN_UNLOCK(q)

	return ret;
}